

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImTriangulator::ReclassifyNode(ImTriangulator *this,ImTriangulatorNode *n1)

{
  ImVec2 *a;
  ImVec2 *c;
  ImTriangulatorNodeType IVar1;
  int iVar2;
  ImTriangulatorNode *pIVar3;
  ImTriangulatorNode *pIVar4;
  ImTriangulatorNode **ppIVar5;
  bool bVar6;
  bool bVar7;
  ImTriangulatorNodeType IVar8;
  long lStackY_50;
  
  pIVar3 = n1->Next;
  pIVar4 = n1->Prev;
  a = &pIVar4->Pos;
  c = &pIVar3->Pos;
  bVar6 = ImTriangleIsClockwise(a,&n1->Pos,c);
  if (bVar6) {
    bVar7 = IsEar(this,pIVar4->Index,n1->Index,pIVar3->Index,a,&n1->Pos,c);
    IVar8 = (ImTriangulatorNodeType)bVar7;
  }
  else {
    IVar8 = ImTriangulatorNodeType_Reflex;
    bVar7 = false;
  }
  IVar1 = n1->Type;
  if (IVar8 == IVar1) {
    return;
  }
  if (IVar1 == ImTriangulatorNodeType_Reflex) {
    lStackY_50 = 0x20;
  }
  else {
    if (IVar1 != ImTriangulatorNodeType_Ear) goto LAB_001777d3;
    lStackY_50 = 0x10;
  }
  ImTriangulatorNodeSpan::find_erase_unsorted
            ((ImTriangulatorNodeSpan *)((long)&this->_TrianglesLeft + lStackY_50),n1->Index);
LAB_001777d3:
  bVar6 = !bVar6;
  if ((bVar7 | bVar6) == 1) {
    ppIVar5 = (&this->_Ears)[bVar6].Data;
    iVar2 = (&this->_Ears)[bVar6].Size;
    (&this->_Ears)[bVar6].Size = iVar2 + 1;
    ppIVar5[iVar2] = n1;
  }
  n1->Type = IVar8;
  return;
}

Assistant:

void ImTriangulator::ReclassifyNode(ImTriangulatorNode* n1)
{
    // Classify node
    ImTriangulatorNodeType type;
    const ImTriangulatorNode* n0 = n1->Prev;
    const ImTriangulatorNode* n2 = n1->Next;
    if (!ImTriangleIsClockwise(n0->Pos, n1->Pos, n2->Pos))
        type = ImTriangulatorNodeType_Reflex;
    else if (IsEar(n0->Index, n1->Index, n2->Index, n0->Pos, n1->Pos, n2->Pos))
        type = ImTriangulatorNodeType_Ear;
    else
        type = ImTriangulatorNodeType_Convex;

    // Update lists when a type changes
    if (type == n1->Type)
        return;
    if (n1->Type == ImTriangulatorNodeType_Reflex)
        _Reflexes.find_erase_unsorted(n1->Index);
    else if (n1->Type == ImTriangulatorNodeType_Ear)
        _Ears.find_erase_unsorted(n1->Index);
    if (type == ImTriangulatorNodeType_Reflex)
        _Reflexes.push_back(n1);
    else if (type == ImTriangulatorNodeType_Ear)
        _Ears.push_back(n1);
    n1->Type = type;
}